

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppLayout.cpp
# Opt level: O1

IWindowPtr __thiscall cursespp::AppLayout::BlurShortcuts(AppLayout *this)

{
  long *plVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char cVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  long *in_RSI;
  IWindowPtr IVar5;
  long local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  undefined1 local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  (**(code **)(*(long *)in_RSI[0x4c] + 0x160))();
  (**(code **)(*(long *)in_RSI[0x4c] + 0x40))();
  plVar1 = (long *)in_RSI[0x4e];
  if (plVar1 != (long *)0x0) {
    lVar2 = in_RSI[0x52];
    if (lVar2 != 0) {
      local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[0x53];
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_38->_M_use_count = local_38->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_38->_M_use_count = local_38->_M_use_count + 1;
        }
      }
      local_40 = lVar2;
      cVar3 = (**(code **)(*plVar1 + 0x1d8))(plVar1,&local_40);
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[0x53];
      in_RSI[0x52] = 0;
      in_RSI[0x53] = 0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (cVar3 != '\0') goto LAB_0015809e;
    }
    (**(code **)(*(long *)in_RSI[0x4e] + 0x210))(local_30);
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
  }
LAB_0015809e:
  (**(code **)(*in_RSI + 0x220))();
  if ((long *)in_RSI[0x4e] == (long *)0x0) {
    (this->super_LayoutBase).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable =
         (_func_int **)0x0;
    (this->super_LayoutBase).super_Window.super_IWindow.super_IDisplayable._vptr_IDisplayable =
         (_func_int **)0x0;
    _Var4._M_pi = extraout_RDX;
  }
  else {
    (**(code **)(*(long *)in_RSI[0x4e] + 0x1d0))(this);
    _Var4._M_pi = extraout_RDX_00;
  }
  IVar5.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  IVar5.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (IWindowPtr)IVar5.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cursespp::IWindowPtr AppLayout::BlurShortcuts() {
    this->shortcuts->Hide();
    this->shortcuts->Blur();

    if (this->layout) {
        bool refocused = false;
        if (this->lastFocus) {
            refocused = this->layout->SetFocus(this->lastFocus);
            this->lastFocus.reset();
        }

        if (!refocused) {
            this->layout->FocusFirst();
        }
    }

    this->Layout();
    return this->layout ? this->layout->GetFocus() : IWindowPtr();
}